

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_backend.cpp
# Opt level: O3

void __thiscall
booster::locale::impl_std::std_localization_backend::set_option
          (std_localization_backend *this,string *name,string *value)

{
  int iVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  
  this->invalid_ = true;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    std::__cxx11::string::_M_assign((string *)&this->locale_id_);
    return;
  }
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_00 = &this->paths_;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        iVar1 = std::__cxx11::string::compare((char *)value);
        this->use_ansi_encoding_ = iVar1 == 0;
      }
      return;
    }
    this_00 = &this->domains_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,value);
  return;
}

Assistant:

void set_option(std::string const &name,std::string const &value) 
        {
            invalid_ = true;
            if(name=="locale")
                locale_id_ = value;
            else if(name=="message_path")
                paths_.push_back(value);
            else if(name=="message_application")
                domains_.push_back(value);
            else if(name=="use_ansi_encoding")
                use_ansi_encoding_ = value == "true";

        }